

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O1

void LoadWalls(walltype *walls,int numwalls,sectortype *bsec)

{
  short sVar1;
  ushort uVar2;
  short sVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  FTextureID FVar10;
  FTextureID FVar11;
  ulong uVar12;
  long lVar13;
  line_t *plVar14;
  side_t *psVar15;
  vertex_t *pvVar16;
  long lVar17;
  DWORD DVar18;
  side_t *psVar19;
  long lVar20;
  long lVar21;
  int linenum;
  SWORD *pSVar22;
  ulong uVar23;
  BYTE *pBVar24;
  char tnam [9];
  SlopeWork local_a8;
  
  numlines = 0;
  uVar23 = (ulong)numwalls;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar23;
  uVar12 = SUB168(auVar6 * ZEXT816(0xd8),0);
  if (SUB168(auVar6 * ZEXT816(0xd8),8) != 0) {
    uVar12 = 0xffffffffffffffff;
  }
  numvertexes = numwalls;
  numsides = numwalls;
  sides = (side_t *)operator_new__(uVar12);
  memset(sides,0,uVar23 * 0xd8);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = uVar23;
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar7 * ZEXT816(0x38),8) == 0) {
    uVar12 = SUB168(auVar7 * ZEXT816(0x38),0);
  }
  vertexes = (vertex_t *)operator_new__(uVar12);
  if (numwalls != 0) {
    pvVar16 = vertexes;
    do {
      (pvVar16->p).X = 0.0;
      (pvVar16->p).Y = 0.0;
      pvVar16->viewangle = 0;
      pvVar16->angletime = 0;
      pvVar16->dirty = true;
      pvVar16->numheights = 0;
      pvVar16->numsectors = 0;
      pvVar16->sectors = (sector_t **)0x0;
      pvVar16->heightlist = (float *)0x0;
      pvVar16 = pvVar16 + 1;
    } while (pvVar16 != vertexes + uVar23);
  }
  numvertexes = 0;
  lVar13 = (long)numsectors;
  if (0 < lVar13) {
    lVar17 = 0;
    do {
      if ((-1 < (long)bsec[lVar17].wallptr) && (lVar20 = (long)bsec[lVar17].wallnum, 0 < lVar20)) {
        lVar21 = (long)bsec[lVar17].wallptr * 0xd8;
        do {
          *(sector_t **)((long)sides->textures + lVar21 + -0x10) = sectors + lVar17;
          lVar21 = lVar21 + 0xd8;
          lVar20 = lVar20 + -1;
        } while (lVar20 != 0);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar13);
  }
  if (0 < numwalls) {
    pBVar24 = &walls->ypanning;
    lVar13 = 0xb4;
    psVar19 = (side_t *)0x0;
    do {
      mysnprintf((char *)&local_a8,9,"BTIL%04d");
      FVar10 = FTextureManager::GetTexture(&TexMan,(char *)&local_a8,5,0);
      mysnprintf((char *)&local_a8,9,"BTIL%04d");
      FVar11 = FTextureManager::GetTexture(&TexMan,(char *)&local_a8,5,0);
      psVar15 = sides;
      dVar9 = (double)pBVar24[-1];
      *(double *)((long)sides->textures + lVar13 + -0x54) = dVar9;
      *(double *)((long)psVar15 + lVar13 + -0x74) = dVar9;
      *(double *)((long)psVar15 + lVar13 + -0xa4) = dVar9;
      dVar9 = (double)*pBVar24;
      *(double *)((long)psVar15->textures + lVar13 + -0x4c) = dVar9;
      *(double *)((long)psVar15->textures + lVar13 + -0x7c) = dVar9;
      *(double *)((long)psVar15 + lVar13 + -0x9c) = dVar9;
      *(int *)((long)psVar15 + lVar13 + -0x84) = FVar10.texnum;
      *(int *)((long)psVar15->textures + lVar13 + -0x34) = FVar10.texnum;
      if ((*(short *)(pBVar24 + -0xd) < 0) || ((*(ushort *)(pBVar24 + -0xb) & 0x20) != 0)) {
        *(int *)((long)psVar15->textures + lVar13 + -100) = FVar10.texnum;
      }
      else if ((*(ushort *)(pBVar24 + -0xb) & 0x10) == 0) {
        *(undefined4 *)((long)psVar15->textures + lVar13 + -100) = 0;
      }
      else {
        *(int *)((long)psVar15->textures + lVar13 + -100) = FVar11.texnum;
      }
      *(ushort *)((long)psVar15->textures + lVar13 + -0x14) = (ushort)pBVar24[-3] << 3;
      uVar12 = -(ulong)((double)pBVar24[-2] * 0.125 == 0.0);
      uVar12 = ~uVar12 & (ulong)((double)pBVar24[-2] * 0.125) | uVar12 & 0x3ff0000000000000;
      *(ulong *)((long)psVar15->textures + lVar13 + -0x3c) = uVar12;
      *(ulong *)((long)psVar15->textures + lVar13 + -0x6c) = uVar12;
      *(ulong *)((long)psVar15 + lVar13 + -0x8c) = uVar12;
      *(undefined8 *)((long)psVar15->textures + lVar13 + -0x44) = 0x3ff0000000000000;
      *(undefined8 *)((long)psVar15->textures + lVar13 + -0x74) = 0x3ff0000000000000;
      *(undefined8 *)((long)psVar15 + lVar13 + -0x94) = 0x3ff0000000000000;
      *(short *)((long)psVar15->textures + lVar13 + -0x12) =
           0xff - ((short)(char)pBVar24[-5] + (short)(char)pBVar24[-5]);
      *(undefined1 *)((long)psVar15->textures + lVar13 + -0x10) = 1;
      sVar1 = *(short *)(pBVar24 + -0x11);
      *(int *)((long)psVar15->textures + lVar13 + -0x18) = (int)sVar1;
      psVar15[sVar1].LeftSide = (DWORD)psVar19;
      lVar17 = (long)*(short *)(pBVar24 + -0xf);
      if ((long)psVar19 < lVar17 || lVar17 < 0) {
        plVar14 = (line_t *)(long)numlines;
        numlines = numlines + 1;
      }
      else {
        plVar14 = psVar15[lVar17].linedef;
      }
      *(line_t **)((long)psVar15->textures + lVar13 + -0x24) = plVar14;
      psVar19 = (side_t *)((long)&psVar19->sector + 1);
      lVar13 = lVar13 + 0xd8;
      pBVar24 = pBVar24 + 0x20;
    } while ((side_t *)(ulong)(uint)numwalls != psVar19);
  }
  uVar23 = (ulong)numlines;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar23;
  uVar12 = 0xffffffffffffffff;
  if (SUB168(auVar8 * ZEXT816(0x98),8) == 0) {
    uVar12 = SUB168(auVar8 * ZEXT816(0x98),0);
  }
  lines = (line_t *)operator_new__(uVar12);
  memset(lines,0,uVar23 * 0x98);
  if (0 < numwalls) {
    pSVar22 = &walls->cstat;
    lVar13 = 0xa0;
    psVar19 = (side_t *)0x0;
    do {
      psVar15 = (side_t *)(long)pSVar22[-2];
      if ((long)psVar15 < 0 || (long)psVar19 < (long)psVar15) {
        iVar4 = *(int *)((long)sides->textures + lVar13 + -0x10);
        lines[iVar4].sidedef[0] = psVar19;
        lines[iVar4].sidedef[1] = psVar15;
        pvVar16 = FindVertex(((walltype *)(pSVar22 + -7))->x,*(SDWORD *)(pSVar22 + -5));
        lines[iVar4].v1 = pvVar16;
        pvVar16 = FindVertex(walls[pSVar22[-3]].x,walls[pSVar22[-3]].y);
        lines[iVar4].v2 = pvVar16;
        lines[iVar4].frontsector = *(sector_t **)((long)sides + lVar13 + -0xa0);
        plVar14 = lines;
        lines[iVar4].flags = lines[iVar4].flags | 0x100000;
        if ((long)pSVar22[-1] < 0) {
          plVar14[iVar4].backsector = (sector_t *)0x0;
        }
        else {
          plVar14[iVar4].backsector = sectors + pSVar22[-1];
          lines[iVar4].flags = lines[iVar4].flags | 4;
        }
        P_AdjustLine(lines + iVar4);
        uVar2 = *pSVar22;
        if ((char)uVar2 < '\0') {
          lines[iVar4].alpha = *(double *)(&DAT_0073d0e0 + (ulong)((uVar2 >> 9 & 1) == 0) * 8);
        }
        if ((uVar2 & 1) != 0) {
          lines[iVar4].flags = lines[iVar4].flags | 1;
        }
        if (pSVar22[-2] < 0) {
          if ((uVar2 & 4) != 0) {
            lines[iVar4].flags = lines[iVar4].flags | 0x10;
          }
        }
        else {
          uVar5 = lines[iVar4].flags;
          if ((uVar2 & 4) == 0) {
            DVar18 = uVar5 | 0x10;
          }
          else {
            DVar18 = uVar5 | 8;
          }
          lines[iVar4].flags = DVar18;
        }
        if ((uVar2 & 0x40) != 0) {
          lines[iVar4].flags = lines[iVar4].flags | 0x8000;
        }
      }
      psVar19 = (side_t *)((long)&psVar19->sector + 1);
      lVar13 = lVar13 + 0xd8;
      pSVar22 = pSVar22 + 0x10;
    } while ((side_t *)(ulong)(uint)numwalls != psVar19);
  }
  if (0 < numsectors) {
    lVar17 = 0xb0;
    lVar13 = 0;
    do {
      sVar1 = bsec->wallptr;
      local_a8.wal = walls + sVar1;
      sVar3 = walls[sVar1].point2;
      local_a8.wal2 = walls + sVar3;
      local_a8.dx = (long)walls[sVar3].x - (long)walls[sVar1].x;
      local_a8.dy = (long)walls[sVar3].y - (long)walls[sVar1].y;
      dVar9 = c_sqrt((double)(local_a8.dy * local_a8.dy + local_a8.dx * local_a8.dx));
      local_a8.i = (long)dVar9 << 5;
      if (local_a8.i != 0) {
        if (((bsec->floorstat & 2) != 0) && ((long)bsec->floorheinum != 0)) {
          local_a8.heinum = -(long)bsec->floorheinum;
          local_a8.z[0] = -(long)bsec->floorZ;
          local_a8.z[1] = local_a8.z[0];
          local_a8.z[2] = local_a8.z[0];
          CalcPlane(&local_a8,(secplane_t *)((long)&sectors->planes[0].xform.xOffs + lVar17));
        }
        if (((bsec->ceilingstat & 2) != 0) && ((long)bsec->ceilingheinum != 0)) {
          local_a8.heinum = -(long)bsec->ceilingheinum;
          local_a8.z[0] = -(long)bsec->ceilingZ;
          local_a8.z[1] = local_a8.z[0];
          local_a8.z[2] = local_a8.z[0];
          CalcPlane(&local_a8,(secplane_t *)((long)&sectors->planes[0].xform.Angle.Degrees + lVar17)
                   );
        }
        linenum = (int)sides[bsec->wallptr].linedef;
        iVar4 = *(int *)(lines[linenum].sidedef + 1);
        if ((bsec->floorstat & 0x40) != 0) {
          P_AlignFlat(linenum,(uint)(iVar4 == bsec->wallptr),0);
        }
        if ((bsec->ceilingstat & 0x40) != 0) {
          P_AlignFlat(linenum,(uint)(iVar4 == bsec->wallptr),0);
        }
      }
      lVar13 = lVar13 + 1;
      bsec = bsec + 1;
      lVar17 = lVar17 + 0x268;
    } while (lVar13 < numsectors);
  }
  lVar13 = (long)numlines;
  if (0 < lVar13) {
    lVar17 = 0;
    do {
      lVar20 = *(long *)((long)lines->sidedef + lVar17);
      lVar21 = *(long *)((long)lines->sidedef + lVar17 + 8);
      psVar19 = sides + lVar20;
      if (lVar20 < 0) {
        psVar19 = (side_t *)0x0;
      }
      *(side_t **)((long)lines->sidedef + lVar17) = psVar19;
      psVar19 = sides + lVar21;
      if (lVar21 < 0) {
        psVar19 = (side_t *)0x0;
      }
      *(side_t **)((long)lines->sidedef + lVar17 + 8) = psVar19;
      lVar17 = lVar17 + 0x98;
    } while (lVar13 * 0x98 - lVar17 != 0);
  }
  lVar13 = (long)numsides;
  if (0 < lVar13) {
    lVar17 = 0;
    do {
      if (*(long *)((long)sides->textures + lVar17 + -0x10) == 0) {
        __assert_fail("sides[i].sector != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_buildmap.cpp"
                      ,0x2a5,"void LoadWalls(walltype *, int, sectortype *)");
      }
      *(line_t **)((long)&sides->linedef + lVar17) =
           lines + *(long *)((long)&sides->linedef + lVar17);
      lVar17 = lVar17 + 0xd8;
    } while (lVar13 * 0xd8 - lVar17 != 0);
  }
  return;
}

Assistant:

static void LoadWalls (walltype *walls, int numwalls, sectortype *bsec)
{
	int i, j;

	// Setting numvertexes to the same as numwalls is overly conservative,
	// but the extra vertices will be removed during the BSP building pass.
	numsides = numvertexes = numwalls;
	numlines = 0;

	sides = new side_t[numsides];
	memset (sides, 0, numsides*sizeof(side_t));

	vertexes = new vertex_t[numvertexes];
	numvertexes = 0;

	// First mark each sidedef with the sector it belongs to
	for (i = 0; i < numsectors; ++i)
	{
		if (bsec[i].wallptr >= 0)
		{
			for (j = 0; j < bsec[i].wallnum; ++j)
			{
				sides[j + bsec[i].wallptr].sector = sectors + i;
			}
		}
	}

	// Now copy wall properties to their matching sidedefs
	for (i = 0; i < numwalls; ++i)
	{
		char tnam[9];
		FTextureID overpic, pic;

		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(walls[i].picnum));
		pic = TexMan.GetTexture (tnam, FTexture::TEX_Build);
		mysnprintf (tnam, countof(tnam), "BTIL%04d", LittleShort(walls[i].overpicnum));
		overpic = TexMan.GetTexture (tnam, FTexture::TEX_Build);

		walls[i].x = LittleLong(walls[i].x);
		walls[i].y = LittleLong(walls[i].y);
		walls[i].point2 = LittleShort(walls[i].point2);
		walls[i].cstat = LittleShort(walls[i].cstat);
		walls[i].nextwall = LittleShort(walls[i].nextwall);
		walls[i].nextsector = LittleShort(walls[i].nextsector);

		sides[i].SetTextureXOffset((double)walls[i].xpanning);
		sides[i].SetTextureYOffset((double)walls[i].ypanning);

		sides[i].SetTexture(side_t::top, pic);
		sides[i].SetTexture(side_t::bottom, pic);
		if (walls[i].nextsector < 0 || (walls[i].cstat & 32))
		{
			sides[i].SetTexture(side_t::mid, pic);
		}
		else if (walls[i].cstat & 16)
		{
			sides[i].SetTexture(side_t::mid, overpic);
		}
		else
		{
			sides[i].SetTexture(side_t::mid, FNullTextureID());
		}

		sides[i].TexelLength = walls[i].xrepeat * 8;
		sides[i].SetTextureYScale(walls[i].yrepeat / 8.);
		sides[i].SetTextureXScale(1.);
		sides[i].SetLight(SHADE2LIGHT(walls[i].shade));
		sides[i].Flags = WALLF_ABSLIGHTING;
		sides[i].RightSide = walls[i].point2;
		sides[walls[i].point2].LeftSide = i;

		if (walls[i].nextwall >= 0 && walls[i].nextwall <= i)
		{
			sides[i].linedef = sides[walls[i].nextwall].linedef;
		}
		else
		{
			sides[i].linedef = (line_t*)(intptr_t)(numlines++);
		}
	}

	// Set line properties that Doom doesn't store per-sidedef
	lines = new line_t[numlines];
	memset (lines, 0, numlines*sizeof(line_t));

	for (i = 0, j = -1; i < numwalls; ++i)
	{
		if (walls[i].nextwall >= 0 && walls[i].nextwall <= i)
		{
			continue;
		}

		j = int(intptr_t(sides[i].linedef));
		lines[j].sidedef[0] = (side_t*)(intptr_t)i;
		lines[j].sidedef[1] = (side_t*)(intptr_t)walls[i].nextwall;
		lines[j].v1 = FindVertex (walls[i].x, walls[i].y);
		lines[j].v2 = FindVertex (walls[walls[i].point2].x, walls[walls[i].point2].y);
		lines[j].frontsector = sides[i].sector;
		lines[j].flags |= ML_WRAP_MIDTEX;
		if (walls[i].nextsector >= 0)
		{
			lines[j].backsector = sectors + walls[i].nextsector;
			lines[j].flags |= ML_TWOSIDED;
		}
		else
		{
			lines[j].backsector = NULL;
		}
		P_AdjustLine (&lines[j]);
		if (walls[i].cstat & 128)
		{
			if (walls[i].cstat & 512)
			{
				lines[j].alpha = 1/3.;
			}
			else
			{
				lines[j].alpha = 2/3.;
			}
		}
		if (walls[i].cstat & 1)
		{
			lines[j].flags |= ML_BLOCKING;
		}
		if (walls[i].nextwall < 0)
		{
			if (walls[i].cstat & 4)
			{
				lines[j].flags |= ML_DONTPEGBOTTOM;
			}
		}
		else
		{
			if (walls[i].cstat & 4)
			{
				lines[j].flags |= ML_DONTPEGTOP;
			}
			else
			{
				lines[j].flags |= ML_DONTPEGBOTTOM;
			}
		}
		if (walls[i].cstat & 64)
		{
			lines[j].flags |= ML_BLOCKEVERYTHING;
		}
	}

	// Finish setting sector properties that depend on walls
	for (i = 0; i < numsectors; ++i, ++bsec)
	{
		SlopeWork slope;

		slope.wal = &walls[bsec->wallptr];
		slope.wal2 = &walls[slope.wal->point2];
		slope.dx = slope.wal2->x - slope.wal->x;
		slope.dy = slope.wal2->y - slope.wal->y;
		slope.i = long (g_sqrt ((double)(slope.dx*slope.dx+slope.dy*slope.dy))) << 5;
		if (slope.i == 0)
		{
			continue;
		}
		if ((bsec->floorstat & 2) && (bsec->floorheinum != 0))
		{ // floor is sloped
			slope.heinum = -LittleShort(bsec->floorheinum);
			slope.z[0] = slope.z[1] = slope.z[2] = -bsec->floorZ;
			CalcPlane (slope, sectors[i].floorplane);
		}
		if ((bsec->ceilingstat & 2) && (bsec->ceilingheinum != 0))
		{ // ceiling is sloped
			slope.heinum = -LittleShort(bsec->ceilingheinum);
			slope.z[0] = slope.z[1] = slope.z[2] = -bsec->ceilingZ;
			CalcPlane (slope, sectors[i].ceilingplane);
		}
		int linenum = int(intptr_t(sides[bsec->wallptr].linedef));
		int sidenum = int(intptr_t(lines[linenum].sidedef[1]));
		if (bsec->floorstat & 64)
		{ // floor is aligned to first wall
			P_AlignFlat (linenum, sidenum == bsec->wallptr, 0);
		}
		if (bsec->ceilingstat & 64)
		{ // ceiling is aligned to first wall
			P_AlignFlat (linenum, sidenum == bsec->wallptr, 0);
		}
	}
	for (i = 0; i < numlines; i++)
	{
		intptr_t front = intptr_t(lines[i].sidedef[0]);
		intptr_t back = intptr_t(lines[i].sidedef[1]);
		lines[i].sidedef[0] = front >= 0 ? &sides[front] : NULL;
		lines[i].sidedef[1] = back >= 0 ? &sides[back] : NULL;
	}
	for (i = 0; i < numsides; i++)
	{
		assert(sides[i].sector != NULL);
		sides[i].linedef = &lines[intptr_t(sides[i].linedef)];
	}
}